

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_scatter2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  C_Integer *pCVar5;
  long lVar6;
  Integer IVar7;
  int iVar8;
  void *__ptr;
  logical lVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  undefined4 uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  void **ppvVar18;
  long lVar19;
  Integer _dim;
  long lVar20;
  long lVar21;
  long lVar22;
  global_array_t *pgVar23;
  uint uVar24;
  long lVar25;
  C_Integer CVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  Integer IVar31;
  long icode;
  long lVar32;
  long *plVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  armci_giov_t desc;
  Integer hi [2];
  Integer lo [2];
  Integer subscrpt [2];
  Integer _lo [2];
  char err_string [256];
  
  if (nv < 1) {
    return;
  }
  lVar35 = g_a + 1000;
  iVar8 = GA[g_a + 1000].type;
  if ((g_a < -1000) || (_max_global_array <= lVar35)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_scatter");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar35].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_scatter");
    pnga_error(err_string,g_a);
  }
  GAstat.numsca = GAstat.numsca + 1;
  iVar3 = GA[lVar35].p_handle;
  lVar20 = (long)iVar3;
  if (lVar20 < 0) {
    lVar34 = GA[lVar35].num_rstrctd;
    if (GA[lVar35].num_rstrctd < 1) {
      lVar34 = GAnproc;
    }
  }
  else {
    lVar34 = (long)PGRP_LIST[lVar20].map_nproc;
  }
  if (GA[lVar35].distr_type == 0) {
    __ptr = malloc((nv << 0x20) + (lVar34 << 0x22) >> 0x1d);
    if (__ptr == (void *)0x0) {
      lVar21 = lVar34;
      lVar25 = 0;
      goto LAB_0018ba31;
    }
    lVar21 = 0;
  }
  else {
    lVar21 = GA[lVar35].block_total;
    __ptr = malloc((nv << 0x20) + (lVar21 << 0x22) >> 0x1d);
    lVar25 = lVar21;
    if (__ptr == (void *)0x0) {
LAB_0018ba31:
      pnga_error("malloc failed",lVar21 * 3);
      __ptr = (void *)0x0;
      lVar21 = lVar25;
    }
  }
  pgVar23 = GA;
  bVar36 = GA[lVar35].distr_type == 0;
  lVar25 = lVar21;
  if (bVar36) {
    lVar25 = lVar34;
  }
  lVar6 = lVar25 * 8 + nv * 8;
  if (bVar36) {
    if (0 < lVar34) {
      lVar16 = 0;
      do {
        *(undefined8 *)((long)__ptr + lVar16 * 8 + nv * 8) = 0;
        *(undefined8 *)((long)__ptr + lVar16 * 8 + lVar6) = 0;
        lVar16 = lVar16 + 1;
      } while (lVar34 != lVar16);
    }
  }
  else if (0 < lVar21) {
    lVar16 = 0;
    do {
      *(undefined8 *)((long)__ptr + lVar16 * 8 + nv * 8) = 0;
      *(undefined8 *)((long)__ptr + lVar16 * 8 + lVar6) = 0;
      lVar16 = lVar16 + 1;
    } while (lVar21 != lVar16);
  }
  if (pgVar23[lVar35].num_rstrctd == 0) {
    lVar16 = 0;
    IVar31 = nv;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar16);
      subscrpt[1] = *(Integer *)((long)j + lVar16);
      lVar9 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar16));
      if (lVar9 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar16),
                *(undefined8 *)((long)j + lVar16));
        pnga_error(err_string,g_a);
      }
      plVar11 = (long *)((long)__ptr + *(Integer *)((long)__ptr + lVar16) * 8 + lVar6);
      *plVar11 = *plVar11 + 1;
      lVar16 = lVar16 + 8;
      IVar31 = IVar31 + -1;
      pgVar23 = GA;
    } while (IVar31 != 0);
  }
  else {
    lVar16 = 0;
    IVar31 = nv;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar16);
      subscrpt[1] = *(Integer *)((long)j + lVar16);
      lVar9 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar16));
      if (lVar9 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar16),
                *(undefined8 *)((long)j + lVar16));
        pnga_error(err_string,g_a);
      }
      pgVar23 = GA;
      plVar11 = (long *)((long)__ptr +
                        GA[lVar35].rank_rstrctd[*(Integer *)((long)__ptr + lVar16)] * 8 + lVar6);
      *plVar11 = *plVar11 + 1;
      lVar16 = lVar16 + 8;
      IVar31 = IVar31 + -1;
    } while (IVar31 != 0);
  }
  lVar16 = lVar25 * 0x10 + nv * 8;
  lVar25 = lVar25 * 0x18 + nv * 8;
  iVar15 = pgVar23[lVar35].distr_type;
  if (iVar15 == 0) {
    if (0 < lVar34) {
      lVar21 = 0;
      icode = 0;
      do {
        if (0 < *(long *)((long)__ptr + lVar21 * 8 + lVar6)) {
          *(long *)((long)__ptr + icode * 8 + lVar16) = lVar21;
          *(long *)((long)__ptr + lVar21 * 8 + lVar25) = icode;
          icode = icode + 1;
        }
        lVar21 = lVar21 + 1;
      } while (lVar34 != lVar21);
      goto LAB_0018bd3a;
    }
  }
  else if (0 < lVar21) {
    lVar10 = 0;
    icode = 0;
    do {
      if (0 < *(long *)((long)__ptr + lVar10 * 8 + lVar6)) {
        *(long *)((long)__ptr + icode * 8 + lVar16) = lVar10;
        *(long *)((long)__ptr + lVar10 * 8 + lVar25) = icode;
        icode = icode + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar21 != lVar10);
    goto LAB_0018bd3a;
  }
  icode = 0;
LAB_0018bd3a:
  GAstat.numsca_procs = GAstat.numsca_procs + icode;
  lVar21 = nv * 0x10;
  plVar11 = (long *)malloc((long)((int)icode * 0x38 + (int)lVar21 + (int)(icode * 8)));
  if (plVar11 == (long *)0x0) {
    pnga_error("malloc failed",icode);
    iVar15 = GA[lVar35].distr_type;
    pgVar23 = GA;
  }
  plVar33 = plVar11 + icode * 2;
  lVar10 = icode * 8 + lVar21;
  lVar19 = icode * 8 + lVar10;
  lVar29 = icode * 8 + lVar19;
  lVar12 = icode * 8 + lVar29;
  if (iVar15 == 0) {
    if (0 < icode) {
      lVar21 = 0;
      do {
        lVar10 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
        if (0 < pgVar23[lVar35].num_rstrctd) {
          lVar10 = pgVar23[lVar35].rstrctd_list[lVar10];
        }
        pnga_distribution(g_a,lVar10,lo,hi);
        plVar33[nv * 2 + icode + lVar21] = lo[0];
        plVar33[nv * 2 + icode * 3 + lVar21] = lo[1];
        plVar33[nv * 2 + icode * 2 + lVar21] = hi[0];
        plVar33[nv * 2 + icode * 4 + lVar21] = hi[1];
        pgVar23 = GA;
        pgVar1 = GA + lVar35;
        lVar10 = GA[lVar35].width[0];
        lVar19 = GA[lVar35].width[1];
        lVar29 = GA[lVar35].num_rstrctd;
        iVar15 = GA[lVar35].distr_type;
        if (iVar15 - 1U < 3) {
          sVar2 = pgVar1->ndim;
          uVar24 = (uint)sVar2;
          lVar12 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
          lVar32 = pgVar1->num_blocks[0];
          lVar22 = (long)(int)lVar12 % lVar32;
          uVar14 = (undefined4)lVar22;
          err_string[0] = (char)uVar14;
          err_string[1] = (char)((uint)uVar14 >> 8);
          err_string[2] = (char)((uint)uVar14 >> 0x10);
          err_string[3] = (char)((uint)uVar14 >> 0x18);
          if (1 < (int)uVar24) {
            lVar30 = 0;
            do {
              lVar12 = (long)((int)lVar12 - (int)lVar22) / lVar32;
              lVar32 = GA[g_a + 1000].num_blocks[lVar30 + 1];
              lVar22 = (long)(int)lVar12 % lVar32;
              *(int *)(err_string + lVar30 * 4 + 4) = (int)lVar22;
              lVar30 = lVar30 + 1;
            } while ((ulong)uVar24 - 1 != lVar30);
          }
          if (0 < sVar2) {
            lVar12 = 0;
            do {
              iVar15 = *(int *)(err_string + lVar12);
              lVar32 = *(long *)((long)GA[g_a + 1000].block_dims + lVar12 * 2);
              *(long *)((long)_lo + lVar12 * 2) = lVar32 * iVar15 + 1;
              lVar32 = ((long)iVar15 + 1) * lVar32;
              lVar22 = *(long *)((long)GA[g_a + 1000].dims + lVar12 * 2);
              if (lVar22 <= lVar32) {
                lVar32 = lVar22;
              }
              *(long *)((long)&desc.src_ptr_array + lVar12 * 2) = lVar32;
              lVar12 = lVar12 + 4;
            } while ((ulong)uVar24 << 2 != lVar12);
          }
        }
        else if (iVar15 == 4) {
          sVar2 = pgVar1->ndim;
          uVar24 = (uint)sVar2;
          lVar12 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
          lVar32 = pgVar1->num_blocks[0];
          lVar22 = (long)(int)lVar12 % lVar32;
          uVar14 = (undefined4)lVar22;
          err_string[0] = (char)uVar14;
          err_string[1] = (char)((uint)uVar14 >> 8);
          err_string[2] = (char)((uint)uVar14 >> 0x10);
          err_string[3] = (char)((uint)uVar14 >> 0x18);
          if (1 < (int)uVar24) {
            lVar30 = 0;
            do {
              lVar12 = (long)((int)lVar12 - (int)lVar22) / lVar32;
              lVar32 = GA[g_a + 1000].num_blocks[lVar30 + 1];
              lVar22 = (long)(int)lVar12 % lVar32;
              *(int *)(err_string + lVar30 * 4 + 4) = (int)lVar22;
              lVar30 = lVar30 + 1;
            } while ((ulong)uVar24 - 1 != lVar30);
          }
          if (0 < sVar2) {
            pCVar5 = GA[lVar35].mapc;
            lVar12 = 0;
            iVar15 = 0;
            do {
              iVar4 = *(int *)(err_string + lVar12);
              lVar22 = (long)iVar15 + (long)iVar4;
              *(C_Integer *)((long)_lo + lVar12 * 2) = pCVar5[lVar22];
              lVar32 = *(long *)((long)pgVar1->num_blocks + lVar12 * 2);
              if ((long)iVar4 < lVar32 + -1) {
                lVar22 = pCVar5[lVar22 + 1] + -1;
              }
              else {
                lVar22 = *(long *)((long)pgVar1->dims + lVar12 * 2);
              }
              *(long *)((long)&desc.src_ptr_array + lVar12 * 2) = lVar22;
              iVar15 = iVar15 + (int)lVar32;
              lVar12 = lVar12 + 4;
            } while ((ulong)uVar24 << 2 != lVar12);
          }
        }
        else if (iVar15 == 0) {
          if (lVar29 == 0) {
            lVar12 = (long)pgVar1->ndim;
            if (0 < lVar12) {
              lVar32 = 1;
              lVar22 = 0;
              do {
                lVar32 = lVar32 * GA[g_a + 1000].nblock[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar12 != lVar22);
              lVar22 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
              if (lVar22 < 0 || lVar32 <= lVar22) goto LAB_0018c294;
              if (0 < pgVar1->ndim) {
                pCVar5 = pgVar1->mapc;
                lVar32 = 0;
                lVar30 = 0;
                do {
                  lVar28 = (long)GA[g_a + 1000].nblock[lVar32];
                  lVar17 = lVar22 % lVar28;
                  _lo[lVar32] = pCVar5[lVar17 + lVar30];
                  if (lVar17 == lVar28 + -1) {
                    ppvVar18 = (void **)GA[g_a + 1000].dims[lVar32];
                  }
                  else {
                    ppvVar18 = (void **)(pCVar5[lVar17 + lVar30 + 1] + -1);
                  }
                  lVar30 = lVar30 + lVar28;
                  (&desc.src_ptr_array)[lVar32] = ppvVar18;
                  lVar32 = lVar32 + 1;
                  lVar22 = lVar22 / lVar28;
                } while (lVar12 != lVar32);
              }
            }
          }
          else {
            lVar32 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
            sVar2 = pgVar1->ndim;
            lVar12 = (long)sVar2;
            if (lVar32 < lVar29) {
              if (0 < sVar2) {
                lVar22 = 1;
                lVar30 = 0;
                do {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[lVar30];
                  lVar30 = lVar30 + 1;
                } while (lVar12 != lVar30);
                if ((lVar32 < 0) || (lVar22 <= lVar32)) goto LAB_0018c294;
                if (0 < sVar2) {
                  pCVar5 = pgVar1->mapc;
                  lVar22 = 0;
                  lVar30 = 0;
                  do {
                    lVar28 = (long)GA[g_a + 1000].nblock[lVar30];
                    lVar17 = lVar32 % lVar28;
                    _lo[lVar30] = pCVar5[lVar17 + lVar22];
                    if (lVar17 == lVar28 + -1) {
                      ppvVar18 = (void **)GA[g_a + 1000].dims[lVar30];
                    }
                    else {
                      ppvVar18 = (void **)(pCVar5[lVar17 + lVar22 + 1] + -1);
                    }
                    lVar22 = lVar22 + lVar28;
                    (&desc.src_ptr_array)[lVar30] = ppvVar18;
                    lVar30 = lVar30 + 1;
                    lVar32 = lVar32 / lVar28;
                  } while (lVar12 != lVar30);
                }
              }
            }
            else {
LAB_0018c294:
              if (0 < (short)lVar12) {
                memset(_lo,0,lVar12 << 3);
                memset(&desc,0xff,lVar12 << 3);
              }
            }
          }
        }
        IVar7 = _lo[1];
        IVar31 = _lo[0];
        ppvVar18 = desc.src_ptr_array;
        if (pgVar1->p_handle == 0) {
          CVar26 = (C_Integer)
                   PGRP_LIST->inv_map_proc_list[*(long *)((long)__ptr + lVar21 * 8 + lVar16)];
        }
        else {
          CVar26 = *(long *)((long)__ptr + lVar21 * 8 + lVar16);
          if (lVar29 != 0) {
            CVar26 = pgVar1->rstrctd_list[CVar26];
          }
        }
        lVar29 = plVar33[nv * 2 + icode + lVar21];
        lVar12 = plVar33[nv * 2 + icode * 3 + lVar21];
        if (((long)desc.src_ptr_array < lVar29 || lVar29 < _lo[0]) ||
           ((long)desc.dst_ptr_array < lVar12 || lVar12 < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation");
          pnga_error(err_string,g_a);
          lVar29 = plVar33[nv * 2 + icode + lVar21];
          lVar12 = plVar33[nv * 2 + icode * 3 + lVar21];
          pgVar23 = GA;
        }
        lVar32 = ((lVar10 * 2 + 1) - IVar31) + (long)ppvVar18;
        plVar33[nv * 2 + lVar21] =
             (long)(pgVar23[lVar35].ptr[CVar26] +
                   ((lVar10 - IVar31) + lVar29 + ((lVar19 - IVar7) + lVar12) * lVar32) *
                   *(long *)(BYTE_ARRAY_001e82b1 + (long)pgVar23[lVar35].type * 0x10 + 0x57));
        plVar33[nv * 2 + icode * 5 + lVar21] = lVar32;
        lVar21 = lVar21 + 1;
      } while (lVar21 != icode);
    }
  }
  else if (0 < icode) {
    lVar22 = 0;
    lVar32 = icode;
    do {
      IVar31 = *(Integer *)((long)__ptr + lVar22 + lVar16);
      pnga_distribution(g_a,IVar31,lo,hi);
      *(Integer *)((long)plVar33 + lVar22 + lVar10) = lo[0];
      *(Integer *)((long)plVar33 + lVar22 + lVar29) = lo[1];
      *(Integer *)((long)plVar33 + lVar22 + lVar19) = hi[0];
      *(Integer *)((long)plVar33 + lVar22 + lVar12) = hi[1];
      pnga_access_block_ptr
                (g_a,IVar31,(void *)((long)plVar33 + lVar22 + lVar21),
                 (Integer *)((long)plVar33 + lVar22 + icode * 8 + lVar12));
      lVar22 = lVar22 + 8;
      lVar32 = lVar32 + -1;
    } while (lVar32 != 0);
  }
  lVar21 = *(long *)(BYTE_ARRAY_001e82b1 + (long)iVar8 * 0x10 + 0x57);
  GAbytes.scatot = (double)lVar21 * (double)nv + GAbytes.scatot;
  GAbytes.scaloc =
       (double)lVar21 *
       (double)*(long *)((long)__ptr + *(long *)((long)__ptr + GAme * 8) * 8 + lVar6) +
       GAbytes.scaloc;
  *plVar11 = (long)plVar33;
  plVar11[icode] = (long)(plVar33 + nv);
  if (1 < icode) {
    lVar10 = *plVar11;
    lVar19 = plVar11[icode];
    lVar29 = 0;
    do {
      lVar12 = *(long *)((long)__ptr + *(long *)((long)__ptr + lVar29 * 8 + lVar16) * 8 + lVar6);
      lVar10 = lVar10 + lVar12 * 8;
      plVar11[lVar29 + 1] = lVar10;
      lVar19 = lVar19 + lVar12 * 8;
      plVar11[icode + lVar29 + 1] = lVar19;
      lVar29 = lVar29 + 1;
    } while (icode + -1 != lVar29);
  }
  lVar10 = 0;
  do {
    lVar19 = *(long *)((long)__ptr + lVar10 * 8);
    if (0 < GA[lVar35].num_rstrctd) {
      lVar19 = GA[lVar35].rank_rstrctd[lVar19];
    }
    lVar29 = *(long *)((long)__ptr + lVar19 * 8 + nv * 8);
    *(long *)((long)__ptr + lVar19 * 8 + nv * 8) = lVar29 + 1;
    uVar13 = *(ulong *)((long)__ptr + lVar19 * 8 + lVar25);
    *(void **)(plVar11[uVar13] + lVar29 * 8) = v;
    lVar19 = i[lVar10];
    lVar12 = plVar33[nv * 2 + icode + uVar13];
    if ((lVar19 < lVar12) || (plVar33[nv * 2 + icode * 2 + uVar13] < lVar19)) {
LAB_0018c641:
      sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar13 & 0xffffffff,
              lVar19,j[lVar10],lVar12,plVar33[nv * 2 + icode * 2 + uVar13],
              plVar33[nv * 2 + icode * 3 + uVar13],plVar33[nv * 2 + icode * 4 + uVar13]);
      pnga_error(err_string,g_a);
      lVar32 = j[lVar10];
      lVar22 = plVar33[nv * 2 + icode * 3 + uVar13];
      lVar19 = i[lVar10];
      lVar12 = plVar33[nv * 2 + icode + uVar13];
    }
    else {
      lVar32 = j[lVar10];
      lVar22 = plVar33[nv * 2 + icode * 3 + uVar13];
      if ((lVar32 < lVar22) || (plVar33[nv * 2 + icode * 4 + uVar13] < lVar32)) goto LAB_0018c641;
    }
    *(long *)(plVar11[icode + uVar13] + lVar29 * 8) =
         (((lVar32 - lVar22) * plVar33[nv * 2 + icode * 5 + uVar13] + lVar19) - lVar12) * lVar21 +
         plVar33[nv * 2 + uVar13];
    lVar10 = lVar10 + 1;
    v = (void *)((long)v + lVar21);
    if (nv == lVar10) {
      iVar8 = (int)lVar21;
      switch(GA[lVar35].distr_type) {
      case 0:
        if (0 < icode) {
          lVar34 = 0;
          do {
            desc.src_ptr_array = (void **)plVar11[lVar34];
            desc.dst_ptr_array = (void **)plVar11[icode + lVar34];
            uVar13 = *(ulong *)((long)__ptr + lVar34 * 8 + lVar16);
            desc.ptr_array_len = *(int *)((long)__ptr + uVar13 * 8 + lVar6);
            if (iVar3 < 0) {
              if (0 < GA[lVar35].num_rstrctd) {
                uVar13 = GA[lVar35].rstrctd_list[uVar13];
              }
            }
            else {
              uVar13 = (ulong)(uint)PGRP_LIST[lVar20].inv_map_proc_list[uVar13];
            }
            desc.bytes = iVar8;
            iVar15 = ARMCI_PutV(&desc,1,(int)uVar13);
            if (iVar15 != 0) {
              pnga_error("scatter failed in armci",(long)iVar15);
            }
            lVar34 = lVar34 + 1;
          } while (icode != lVar34);
        }
        break;
      case 1:
        if (0 < icode) {
          lVar35 = 0;
          do {
            desc.src_ptr_array = (void **)plVar11[lVar35];
            desc.dst_ptr_array = (void **)plVar11[icode + lVar35];
            lVar21 = *(long *)((long)__ptr + lVar35 * 8 + lVar16);
            uVar13 = lVar21 % lVar34;
            desc.ptr_array_len = *(int *)((long)__ptr + lVar21 * 8 + lVar6);
            if (-1 < iVar3) {
              uVar13 = (ulong)(uint)PGRP_LIST[lVar20].inv_map_proc_list[uVar13];
            }
            desc.bytes = iVar8;
            iVar15 = ARMCI_PutV(&desc,1,(int)uVar13);
            if (iVar15 != 0) {
              pnga_error("scatter failed in armci",(long)iVar15);
            }
            lVar35 = lVar35 + 1;
          } while (icode != lVar35);
        }
        break;
      case 2:
        if (0 < icode) {
          lVar34 = 0;
          do {
            desc.src_ptr_array = (void **)plVar11[lVar34];
            desc.dst_ptr_array = (void **)plVar11[icode + lVar34];
            lVar21 = *(long *)((long)__ptr + lVar34 * 8 + lVar16);
            desc.ptr_array_len = *(int *)((long)__ptr + lVar21 * 8 + lVar6);
            sVar2 = GA[lVar35].ndim;
            uVar24 = (uint)sVar2;
            lVar25 = GA[lVar35].num_blocks[0];
            lVar10 = (long)(int)lVar21 % lVar25;
            if (1 < (int)uVar24) {
              lVar29 = 0;
              lVar19 = lVar10;
              do {
                lVar21 = ((int)lVar21 - lVar19) / lVar25;
                lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                lVar19 = (long)(int)lVar21 % lVar25;
                *(long *)(err_string + lVar29 * 8 + 8) = lVar19;
                lVar29 = lVar29 + 1;
              } while ((ulong)uVar24 - 1 != lVar29);
            }
            err_string._0_8_ = lVar10 % (long)GA[lVar35].nblock[0];
            err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar35].nblock[1];
            if (sVar2 < 1) {
              uVar13 = _lo[(long)(int)uVar24 + -1];
            }
            else {
              uVar13 = 0;
              do {
                _lo[uVar13] = *(long *)(err_string + uVar13 * 8) %
                              (long)GA[g_a + 1000].nblock[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar24 != uVar13);
              uVar13 = _lo[(long)(int)uVar24 + -1];
              if (1 < sVar2) {
                uVar27 = (ulong)(uVar24 - 2);
                do {
                  uVar13 = (long)GA[g_a + 1000].nblock[uVar27] * uVar13 + _lo[uVar27];
                  bVar36 = uVar27 != 0;
                  uVar27 = uVar27 - 1;
                } while (bVar36);
              }
            }
            if (-1 < iVar3) {
              uVar13 = (ulong)(uint)PGRP_LIST[lVar20].inv_map_proc_list[uVar13];
            }
            desc.bytes = iVar8;
            iVar15 = ARMCI_PutV(&desc,1,(int)uVar13);
            if (iVar15 != 0) {
              pnga_error("scatter failed in armci",(long)iVar15);
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 != icode);
        }
        break;
      case 3:
      case 4:
        if (0 < icode) {
          lVar34 = 0;
          do {
            desc.src_ptr_array = (void **)plVar11[lVar34];
            desc.dst_ptr_array = (void **)plVar11[icode + lVar34];
            lVar21 = *(long *)((long)__ptr + lVar34 * 8 + lVar16);
            desc.ptr_array_len = *(int *)((long)__ptr + lVar21 * 8 + lVar6);
            sVar2 = GA[lVar35].ndim;
            uVar24 = (uint)sVar2;
            lVar25 = GA[lVar35].num_blocks[0];
            lVar10 = (long)(int)lVar21 % lVar25;
            if (1 < (int)uVar24) {
              lVar29 = 0;
              lVar19 = lVar10;
              do {
                lVar21 = ((int)lVar21 - lVar19) / lVar25;
                lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                lVar19 = (long)(int)lVar21 % lVar25;
                *(long *)(err_string + lVar29 * 8 + 8) = lVar19;
                lVar29 = lVar29 + 1;
              } while ((ulong)uVar24 - 1 != lVar29);
            }
            err_string._0_8_ = lVar10 % (long)GA[lVar35].nblock[0];
            err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar35].nblock[1];
            if (sVar2 < 1) {
              uVar13 = _lo[(long)(int)uVar24 + -1];
            }
            else {
              uVar13 = 0;
              do {
                _lo[uVar13] = *(long *)(err_string + uVar13 * 8) %
                              (long)GA[g_a + 1000].nblock[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar24 != uVar13);
              uVar13 = _lo[(long)(int)uVar24 + -1];
              if (1 < sVar2) {
                uVar27 = (ulong)(uVar24 - 2);
                do {
                  uVar13 = (long)GA[g_a + 1000].nblock[uVar27] * uVar13 + _lo[uVar27];
                  bVar36 = uVar27 != 0;
                  uVar27 = uVar27 - 1;
                } while (bVar36);
              }
            }
            if (-1 < iVar3) {
              uVar13 = (ulong)(uint)PGRP_LIST[lVar20].inv_map_proc_list[uVar13];
            }
            desc.bytes = iVar8;
            iVar15 = ARMCI_PutV(&desc,1,(int)uVar13);
            if (iVar15 != 0) {
              pnga_error("scatter failed in armci",(long)iVar15);
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 != icode);
        }
      }
      free(plVar11);
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void pnga_scatter2d(Integer g_a, void *v, Integer *i, Integer *j, Integer nv)
{
    register Integer k;
    Integer kk;
    Integer item_size;
    Integer proc, type=GA[GA_OFFSET + g_a].type;
    Integer nproc, p_handle, iproc;
    Integer subscrpt[2];

    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    
    if (nv < 1) return;
    
    ga_check_handleM(g_a, "ga_scatter");
    
    GAstat.numsca++;
    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }
    
    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int) (nproc *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int) (num_blocks *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
   
    owner = (Integer *)buf1;  
    count = owner+ nv;  
    if (GA[handle].distr_type == REGULAR) {
      nelem =  count + nproc;  
      aproc = count + 2 * nproc;  
      map = count + 3 * nproc;  
    } else {
      nelem =  count + num_blocks;  
      aproc = count + 2 * num_blocks;  
      map = count + 3 * num_blocks;  
    }

    /* initialize the counters and nelem */
    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }
    
    /* find proc that owns the (i,j) element; store it in temp:  */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    
    GAstat.numsca_procs += naproc;

    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
                    iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    /* determine limit for message size --  v,i, & j will travel together */
    item_size = GAsizeofM(type);
    GAbytes.scatot += (double)item_size*nv ;
    iproc = owner[GAme];
    GAbytes.scaloc += (double)item_size* nelem[iproc];
    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
                    proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc];
        ptr_src[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
             (int)proc, (long)i[k], (long)j[k], (long)ilo[proc], 
             (long)ihi[proc], (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_dst[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);

}